

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aniconverter.h
# Opt level: O0

int ani::extract_ani_frames(path *p,path *out_p)

{
  bool bVar1;
  _Ios_Openmode __mode;
  ulong uVar2;
  ostream *poVar3;
  reference pvVar4;
  uchar *puVar5;
  reference __x;
  char *pcVar6;
  undefined1 auVar7 [16];
  undefined1 local_4d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> f;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range1;
  finfo f_info;
  int i;
  ofstream outfile;
  allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_299;
  undefined1 local_298 [8];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  frames;
  undefined8 local_278;
  undefined8 local_260;
  pos_type fileSize;
  ifstream aniFile;
  undefined1 auStack_48 [8];
  ani_header header;
  path *out_p_local;
  path *p_local;
  
  header.file_size = 0;
  header.unknown_0 = 0;
  header.framerate = 0;
  auStack_48 = (undefined1  [8])0x0;
  header.signature = 0;
  header.frames_count = 0;
  __mode = std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)&fileSize._M_state,p,__mode);
  auVar7 = std::istream::tellg();
  fileSize._M_off = auVar7._8_8_;
  local_260 = auVar7._0_8_;
  uVar2 = std::fpos::operator_cast_to_long((fpos *)&local_260);
  if (uVar2 < 0x20) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"ANI file too short");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    p_local._4_4_ = -1;
  }
  else {
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)
               &frames.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    std::istream::seekg(&fileSize._M_state,
                        frames.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_278);
    std::istream::read((char *)&fileSize._M_state,(long)auStack_48);
    if (auStack_48._0_4_ == 0x8f2a6ec9) {
      print_ani_header((ani_header *)auStack_48);
      uVar2 = (ulong)auStack_48 >> 0x20;
      std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
                (&local_299);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_298,uVar2,&local_299);
      std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
                (&local_299);
      std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                ((ofstream *)&f_info,out_p,_S_bin);
      for (__range1._4_4_ = 0; __range1._4_4_ < (uint)auStack_48._4_4_;
          __range1._4_4_ = __range1._4_4_ + 1) {
        __range1._0_4_ = 0;
        std::istream::read((char *)&fileSize._M_state,(long)&__range1);
        poVar3 = std::operator<<((ostream *)&std::cout,"Frame ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,__range1._4_4_);
        poVar3 = std::operator<<(poVar3," sz: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)__range1 & 0x7fffffff);
        pcVar6 = "";
        if (((uint)__range1 & 0x80000000) != 0) {
          pcVar6 = " (start frame)";
        }
        poVar3 = std::operator<<(poVar3,pcVar6);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pvVar4 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)local_298,(long)(int)__range1._4_4_);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (pvVar4,(ulong)((uint)__range1 & 0x7fffffff));
        pvVar4 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)local_298,(long)(int)__range1._4_4_);
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar4);
        std::istream::read((char *)&fileSize._M_state,(long)puVar5);
      }
      __end1 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::begin((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_298);
      f.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::end((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_298);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          (&__end1,(__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                    *)&f.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __x = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::operator*(&__end1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4d8,__x);
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4d8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4d8);
        std::ostream::write((char *)&f_info,(long)puVar5);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4d8);
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++(&__end1);
      }
      p_local._4_4_ = 0;
      std::ofstream::~ofstream(&f_info);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)local_298);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"ANI signature mismatch");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      p_local._4_4_ = -1;
    }
  }
  std::ifstream::~ifstream(&fileSize._M_state);
  return p_local._4_4_;
}

Assistant:

inline int extract_ani_frames(const fs::path &p, const fs::path &out_p) {

        ani_header header{};

        ifstream aniFile(p, ios::binary | ios::ate);
        auto fileSize = aniFile.tellg();
        if (fileSize < sizeof(ani_header)) {
            std::cerr << "ANI file too short" << std::endl;
            return -1;
        }

        aniFile.seekg(0);
        aniFile.read(reinterpret_cast<char *>(&header), sizeof(ani_header));
        if (header.signature != ANI_MAGIC) {
            std::cerr << "ANI signature mismatch" << std::endl;
            return -1;
        }

        print_ani_header(header);

        vector<vector<uint8_t>> frames(header.frames_count);

        ofstream outfile(out_p, ios::binary);

        for (auto i = 0; i < header.frames_count; ++i) {
            finfo f_info{};
            aniFile.read(reinterpret_cast<char *>(&f_info), sizeof(finfo));

            std::cout << "Frame " << i << " sz: " << f_info.length
                      << (f_info.start_frame? " (start frame)" : "") << std::endl;

            frames[i].resize(f_info.length);
            aniFile.read(reinterpret_cast<char *>(frames[i].data()), f_info.length);
        }

        for (auto f : frames) {
            outfile.write(reinterpret_cast<char *>(f.data()), (long) f.size());
        }

        return 0;
    }